

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddAbs.c
# Opt level: O3

DdNode * cuddBddXorExistAbstractRecur(DdManager *manager,DdNode *f,DdNode *g,DdNode *cube)

{
  DdHalfWord *pDVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int *piVar6;
  uint uVar7;
  DdNode *pDVar8;
  uint *puVar9;
  uint index;
  DdNode *pDVar10;
  DdNode *pDVar11;
  uint *puVar12;
  DdNode *pDVar13;
  DdNode *g_00;
  DdNode *g_01;
  DdNode *pDVar14;
  DdNode *cube_00;
  DdHalfWord *pDVar15;
  bool bVar16;
  
  pDVar11 = manager->one;
  pDVar8 = (DdNode *)((ulong)pDVar11 ^ 1);
  if (f != g) {
    do {
      if (f == (DdNode *)((ulong)g ^ 1)) {
        return pDVar11;
      }
      if (pDVar11 == cube) {
        pDVar11 = cuddBddXorRecur(manager,f,g);
        return pDVar11;
      }
      pDVar13 = (DdNode *)((ulong)g ^ 1);
      if (pDVar11 == f) {
LAB_007f35cb:
        pDVar11 = cuddBddExistAbstractRecur(manager,pDVar13,cube);
        return pDVar11;
      }
      if (pDVar11 == g) {
        pDVar13 = (DdNode *)((ulong)f ^ 1);
        goto LAB_007f35cb;
      }
      pDVar13 = g;
      if ((pDVar8 == f) || (pDVar13 = f, pDVar8 == g)) goto LAB_007f35cb;
      pDVar13 = g;
      g_01 = f;
      if ((long)((ulong)((uint)f & 1) + *(long *)(((ulong)f & 0xfffffffffffffffe) + 0x20) * 2) <=
          (long)((ulong)((uint)g & 1) + *(long *)(((ulong)g & 0xfffffffffffffffe) + 0x20) * 2)) {
        pDVar13 = f;
        g_01 = g;
      }
      pDVar8 = cuddCacheLookup(manager,10,pDVar13,g_01,cube);
      if (pDVar8 != (DdNode *)0x0) {
        return pDVar8;
      }
      puVar12 = (uint *)((ulong)pDVar13 & 0xfffffffffffffffe);
      piVar6 = manager->perm;
      uVar2 = *puVar12;
      uVar3 = piVar6[uVar2];
      puVar9 = (uint *)((ulong)g_01 & 0xfffffffffffffffe);
      uVar4 = piVar6[*puVar9];
      uVar7 = uVar3;
      if (uVar4 < uVar3) {
        uVar7 = uVar4;
      }
      uVar5 = piVar6[cube->index];
      if (uVar7 <= uVar5) {
        pDVar8 = pDVar13;
        pDVar14 = pDVar13;
        index = *puVar9;
        if (uVar3 <= uVar4) {
          pDVar8 = *(DdNode **)(puVar12 + 4);
          pDVar14 = *(DdNode **)(puVar12 + 6);
          index = uVar2;
          if (((ulong)pDVar13 & 1) != 0) {
            pDVar8 = (DdNode *)((ulong)pDVar8 ^ 1);
            pDVar14 = (DdNode *)((ulong)pDVar14 ^ 1);
          }
        }
        pDVar10 = g_01;
        g_00 = g_01;
        if (uVar4 <= uVar3) {
          pDVar10 = *(DdNode **)(puVar9 + 4);
          g_00 = *(DdNode **)(puVar9 + 6);
          if (((ulong)g_01 & 1) != 0) {
            pDVar10 = (DdNode *)((ulong)pDVar10 ^ 1);
            g_00 = (DdNode *)((ulong)g_00 ^ 1);
          }
        }
        cube_00 = cube;
        if (uVar5 == uVar7) {
          cube_00 = (cube->type).kids.T;
        }
        pDVar8 = cuddBddXorExistAbstractRecur(manager,pDVar8,pDVar10,cube_00);
        if (pDVar8 == (DdNode *)0x0) {
          return (DdNode *)0x0;
        }
        if ((uVar5 == uVar7) && (pDVar8 == pDVar11)) goto LAB_007f37e7;
        pDVar11 = (DdNode *)((ulong)pDVar8 & 0xfffffffffffffffe);
        pDVar11->ref = pDVar11->ref + 1;
        pDVar14 = cuddBddXorExistAbstractRecur(manager,pDVar14,g_00,cube_00);
        if (pDVar14 == (DdNode *)0x0) goto LAB_007f3804;
        piVar6 = (int *)(((ulong)pDVar14 & 0xfffffffffffffffe) + 4);
        *piVar6 = *piVar6 + 1;
        if (uVar5 == uVar7) {
          pDVar10 = cuddBddAndRecur(manager,(DdNode *)((ulong)pDVar8 ^ 1),
                                    (DdNode *)((ulong)pDVar14 ^ 1));
          if (pDVar10 == (DdNode *)0x0) {
            Cudd_IterDerefBdd(manager,pDVar8);
            pDVar8 = pDVar14;
            goto LAB_007f3804;
          }
          pDVar11 = (DdNode *)((ulong)pDVar10 ^ 1);
          piVar6 = (int *)(((ulong)pDVar10 & 0xfffffffffffffffe) + 4);
          *piVar6 = *piVar6 + 1;
          pDVar15 = (DdHalfWord *)(((ulong)pDVar10 & 0xfffffffffffffffe) + 4);
          Cudd_IterDerefBdd(manager,pDVar8);
          Cudd_IterDerefBdd(manager,pDVar14);
        }
        else {
          pDVar1 = &pDVar11->ref;
          pDVar15 = (DdHalfWord *)(((ulong)pDVar14 & 0xfffffffffffffffe) + 4);
          if (pDVar8 != pDVar14) {
            if (((ulong)pDVar8 & 1) == 0) {
              pDVar11 = cuddUniqueInter(manager,index,pDVar8,pDVar14);
              if (pDVar11 != (DdNode *)0x0) {
LAB_007f37c5:
                *pDVar15 = *pDVar15 - 1;
                pDVar15 = pDVar1;
                goto LAB_007f37c8;
              }
            }
            else {
              pDVar11 = cuddUniqueInter(manager,index,pDVar11,(DdNode *)((ulong)pDVar14 ^ 1));
              if (pDVar11 != (DdNode *)0x0) {
                pDVar11 = (DdNode *)((ulong)pDVar11 ^ 1);
                goto LAB_007f37c5;
              }
            }
            Cudd_IterDerefBdd(manager,pDVar8);
            pDVar8 = pDVar14;
LAB_007f3804:
            Cudd_IterDerefBdd(manager,pDVar8);
            return (DdNode *)0x0;
          }
          *pDVar1 = *pDVar1 - 1;
          pDVar11 = pDVar8;
        }
LAB_007f37c8:
        *pDVar15 = *pDVar15 - 1;
LAB_007f37e7:
        cuddCacheInsert(manager,10,pDVar13,g_01,cube,pDVar11);
        return pDVar11;
      }
      cube = (cube->type).kids.T;
      pDVar11 = manager->one;
      pDVar8 = (DdNode *)((ulong)pDVar11 ^ 1);
      bVar16 = g != f;
      g = g_01;
      f = pDVar13;
    } while (bVar16);
  }
  return pDVar8;
}

Assistant:

DdNode *
cuddBddXorExistAbstractRecur(
  DdManager * manager,
  DdNode * f,
  DdNode * g,
  DdNode * cube)
{
    DdNode *F, *fv, *fnv, *G, *gv, *gnv;
    DdNode *one, *zero, *r, *t, *e, *Cube;
    unsigned int topf, topg, topcube, top, index;

    statLine(manager);
    one = DD_ONE(manager);
    zero = Cudd_Not(one);

    /* Terminal cases. */
    if (f == g) {
        return(zero);
    }
    if (f == Cudd_Not(g)) {
        return(one);
    }
    if (cube == one) {
        return(cuddBddXorRecur(manager, f, g));
    }
    if (f == one) {
        return(cuddBddExistAbstractRecur(manager, Cudd_Not(g), cube));
    }
    if (g == one) {
        return(cuddBddExistAbstractRecur(manager, Cudd_Not(f), cube));
    }
    if (f == zero) {
        return(cuddBddExistAbstractRecur(manager, g, cube));
    }
    if (g == zero) {
        return(cuddBddExistAbstractRecur(manager, f, cube));
    }

    /* At this point f, g, and cube are not constant. */

    if (cuddF2L(f) > cuddF2L(g)) { /* Try to increase cache efficiency. */
        DdNode *tmp = f;
        f = g;
        g = tmp;
    }

    /* Check cache. */
    r = cuddCacheLookup(manager, DD_BDD_XOR_EXIST_ABSTRACT_TAG, f, g, cube);
    if (r != NULL) {
        return(r);
    }

    /* Here we can skip the use of cuddI, because the operands are known
    ** to be non-constant.
    */
    F = Cudd_Regular(f);
    topf = manager->perm[F->index];
    G = Cudd_Regular(g);
    topg = manager->perm[G->index];
    top = ddMin(topf, topg);
    topcube = manager->perm[cube->index];

    if (topcube < top) {
        return(cuddBddXorExistAbstractRecur(manager, f, g, cuddT(cube)));
    }
    /* Now, topcube >= top. */

    if (topf == top) {
        index = F->index;
        fv = cuddT(F);
        fnv = cuddE(F);
        if (Cudd_IsComplement(f)) {
            fv = Cudd_Not(fv);
            fnv = Cudd_Not(fnv);
        }
    } else {
        index = G->index;
        fv = fnv = f;
    }

    if (topg == top) {
        gv = cuddT(G);
        gnv = cuddE(G);
        if (Cudd_IsComplement(g)) {
            gv = Cudd_Not(gv);
            gnv = Cudd_Not(gnv);
        }
    } else {
        gv = gnv = g;
    }

    if (topcube == top) {
        Cube = cuddT(cube);
    } else {
        Cube = cube;
    }

    t = cuddBddXorExistAbstractRecur(manager, fv, gv, Cube);
    if (t == NULL) return(NULL);

    /* Special case: 1 OR anything = 1. Hence, no need to compute
    ** the else branch if t is 1.
    */
    if (t == one && topcube == top) {
        cuddCacheInsert(manager, DD_BDD_XOR_EXIST_ABSTRACT_TAG, f, g, cube, one);
        return(one);
    }
    cuddRef(t);

    e = cuddBddXorExistAbstractRecur(manager, fnv, gnv, Cube);
    if (e == NULL) {
        Cudd_IterDerefBdd(manager, t);
        return(NULL);
    }
    cuddRef(e);

    if (topcube == top) {       /* abstract */
        r = cuddBddAndRecur(manager, Cudd_Not(t), Cudd_Not(e));
        if (r == NULL) {
            Cudd_IterDerefBdd(manager, t);
            Cudd_IterDerefBdd(manager, e);
            return(NULL);
        }
        r = Cudd_Not(r);
        cuddRef(r);
        Cudd_IterDerefBdd(manager, t);
        Cudd_IterDerefBdd(manager, e);
        cuddDeref(r);
    } else if (t == e) {
        r = t;
        cuddDeref(t);
        cuddDeref(e);
    } else {
        if (Cudd_IsComplement(t)) {
            r = cuddUniqueInter(manager,(int)index,Cudd_Not(t),Cudd_Not(e));
            if (r == NULL) {
                Cudd_IterDerefBdd(manager, t);
                Cudd_IterDerefBdd(manager, e);
                return(NULL);
            }
            r = Cudd_Not(r);
        } else {
            r = cuddUniqueInter(manager,(int)index,t,e);
            if (r == NULL) {
                Cudd_IterDerefBdd(manager, t);
                Cudd_IterDerefBdd(manager, e);
                return(NULL);
            }
        }
        cuddDeref(e);
        cuddDeref(t);
    }
    cuddCacheInsert(manager, DD_BDD_XOR_EXIST_ABSTRACT_TAG, f, g, cube, r);
    return (r);

}